

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_frame_pack_altsvc(nghttp2_bufs *bufs,nghttp2_extension *frame)

{
  undefined8 *puVar1;
  nghttp2_buf_chain *pnVar2;
  int iVar3;
  nghttp2_ext_altsvc *altsvc;
  nghttp2_buf *buf;
  int rv;
  nghttp2_extension *frame_local;
  nghttp2_bufs *bufs_local;
  
  puVar1 = (undefined8 *)frame->payload;
  pnVar2 = bufs->head;
  if ((ulong)((long)(pnVar2->buf).end - (long)(pnVar2->buf).last) <
      (ulong)(puVar1[1] + 2 + puVar1[3])) {
    __assert_fail("nghttp2_buf_avail(buf) >= 2 + altsvc->origin_len + altsvc->field_value_len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                  ,0x2e3,"int nghttp2_frame_pack_altsvc(nghttp2_bufs *, nghttp2_extension *)");
  }
  (pnVar2->buf).pos = (pnVar2->buf).pos + -9;
  nghttp2_frame_pack_frame_hd((pnVar2->buf).pos,&frame->hd);
  nghttp2_put_uint16be((pnVar2->buf).last,(uint16_t)puVar1[1]);
  (pnVar2->buf).last = (pnVar2->buf).last + 2;
  iVar3 = nghttp2_bufs_add(bufs,(void *)*puVar1,puVar1[1]);
  if (iVar3 == 0) {
    iVar3 = nghttp2_bufs_add(bufs,(void *)puVar1[2],puVar1[3]);
    if (iVar3 == 0) {
      return 0;
    }
    __assert_fail("rv == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                  ,0x2f2,"int nghttp2_frame_pack_altsvc(nghttp2_bufs *, nghttp2_extension *)");
  }
  __assert_fail("rv == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_frame.c"
                ,0x2ee,"int nghttp2_frame_pack_altsvc(nghttp2_bufs *, nghttp2_extension *)");
}

Assistant:

int nghttp2_frame_pack_altsvc(nghttp2_bufs *bufs, nghttp2_extension *frame) {
  int rv;
  nghttp2_buf *buf;
  nghttp2_ext_altsvc *altsvc;

  /* This is required with --disable-assert. */
  (void)rv;

  altsvc = frame->payload;

  buf = &bufs->head->buf;

  assert(nghttp2_buf_avail(buf) >=
         2 + altsvc->origin_len + altsvc->field_value_len);

  buf->pos -= NGHTTP2_FRAME_HDLEN;

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  nghttp2_put_uint16be(buf->last, (uint16_t)altsvc->origin_len);
  buf->last += 2;

  rv = nghttp2_bufs_add(bufs, altsvc->origin, altsvc->origin_len);

  assert(rv == 0);

  rv = nghttp2_bufs_add(bufs, altsvc->field_value, altsvc->field_value_len);

  assert(rv == 0);

  return 0;
}